

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::CircularQueue<long>::emplace_back<long>(CircularQueue<long> *this,long *args)

{
  uint64_t pos;
  size_t sVar1;
  long *plVar2;
  long *slot;
  long *args_local;
  CircularQueue<long> *this_local;
  
  increment_generation(this);
  sVar1 = size(this);
  if (this->capacity_ <= sVar1) {
    Grow(this,0);
  }
  pos = this->end_;
  this->end_ = pos + 1;
  plVar2 = Get(this,pos);
  *plVar2 = *args;
  return;
}

Assistant:

void emplace_back(Args&&... args) {
    increment_generation();
    if (PERFETTO_UNLIKELY(size() >= capacity_))
      Grow();
    T* slot = Get(end_++);
    new (slot) T(std::forward<Args>(args)...);
  }